

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O3

int border_top_proc(Am_Object *self)

{
  int iVar1;
  Am_Value *this;
  Am_Object AStack_18;
  Am_Object local_10;
  
  Am_Object::Get_Object((ushort)&local_10,(ulong)self);
  Am_Object::Get_Object((ushort)&AStack_18,(ulong)&local_10);
  this = (Am_Value *)Am_Object::Get((ushort)&AStack_18,0x67);
  iVar1 = Am_Value::operator_cast_to_int(this);
  Am_Object::~Am_Object(&AStack_18);
  Am_Object::~Am_Object(&local_10);
  return iVar1 + 0x10;
}

Assistant:

Am_Define_Formula(int, border_top)
{
  return 16 + (int)self.Get_Owner().Get_Object(BUTTON).Get(Am_HEIGHT);
}